

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O2

void CTcGenTarg::multimethod_init_cb(void *ctx0,CTcSymbol *sym)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  textchar_t *sym_00;
  char *pcVar4;
  int iVar5;
  CTcSymbol *pCVar6;
  CTcSymMetaclass *mc;
  size_t in_RCX;
  size_t __n;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  void *__buf_01;
  ulong uVar7;
  CTcGenTarg *pCVar8;
  char *sym_01;
  char *pcVar9;
  ulong len;
  CTcSymMetaclass *pCVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  byte local_b9;
  undefined1 local_88 [24];
  int local_70;
  undefined4 uStack_6c;
  undefined8 uStack_68;
  byte local_60;
  CTcConstVal val;
  
  if (*(int *)&(sym->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 == 1) {
    pcVar2 = (sym->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.str_;
    sVar3 = (sym->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.len_;
    for (uVar7 = 0; lVar12 = sVar3 - uVar7, lVar12 != 0; uVar7 = uVar7 + 1) {
      if (pcVar2[uVar7] == L'*') {
        sym_00 = (sym->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.str_;
        pCVar6 = CTcPrsSymtab::find(G_prs->global_symtab_,sym_00,
                                    (size_t)(pcVar2 + (uVar7 - (long)sym_00)));
        if (pCVar6 == (CTcSymbol *)0x0) {
          return;
        }
        if (*(int *)&(pCVar6->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.
                     field_0x24 != 1) {
          return;
        }
        sym_01 = pcVar2 + lVar12 + uVar7;
        lVar12 = ~uVar7 + sVar3;
        uVar11 = 0;
        goto LAB_001e58dc;
      }
      iVar5 = is_sym((int)pcVar2[uVar7]);
      if (iVar5 == 0) {
        return;
      }
    }
  }
  return;
LAB_001e58dc:
  if (lVar12 == 0) {
    if (uVar11 < 0x100) {
      write_op(G_cg,0xc0);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)uVar11,__buf,in_RCX);
      __buf_00 = extraout_RDX;
    }
    else {
      write_op(G_cg,0xc1);
      CTcDataStream::write2(&G_cs->super_CTcDataStream,uVar11);
      __buf_00 = extraout_RDX_00;
    }
    CTcDataStream::write
              (&G_cs->super_CTcDataStream,(int)(char)G_cg->predef_meta_idx_[1],__buf_00,in_RCX);
    write_op(G_cg,0x8b);
    pCVar8 = G_cg;
    iVar5 = G_cg->sp_depth_ - uVar11;
    uVar11 = iVar5 + 1;
    __n = (size_t)uVar11;
    G_cg->sp_depth_ = uVar11;
    if (pCVar8->max_sp_depth_ <= iVar5) {
      pCVar8->max_sp_depth_ = uVar11;
    }
    (*(sym->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0x18])
              (sym,0);
    (*(pCVar6->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0x18]
    )(pCVar6,0);
    if (*ctx0 != 0) {
      write_op(G_cg,'X');
      CTcDataStream::write(&G_cs->super_CTcDataStream,3,__buf_01,__n);
      CTcSymFuncBase::add_abs_fixup(*ctx0,&G_cs->super_CTcDataStream);
      CTcDataStream::write4(&G_cs->super_CTcDataStream,0);
    }
    G_cg->sp_depth_ = G_cg->sp_depth_ + -3;
    *(int *)((long)ctx0 + 8) = *(int *)((long)ctx0 + 8) + 1;
    return;
  }
  pcVar9 = sym_01 + -lVar12;
  uVar13 = 0;
  pcVar4 = sym_01;
  while ((sym_01 = pcVar9, len = lVar12 - 1U, lVar12 - 1U != uVar13 &&
         (sym_01 = pcVar4 + -1, len = uVar13, pcVar4[-2] != ';'))) {
    uVar13 = uVar13 + 1;
    pcVar4 = pcVar4 + -1;
  }
  if (len == 3) {
    iVar5 = bcmp(sym_01,"...",3);
    if (iVar5 != 0) goto LAB_001e595d;
    val.typ_ = TC_CVT_UNK;
    val._32_1_ = val._32_1_ & 0xfe;
    CTcConstVal::set_sstr(&val,"...",3);
    local_60 = val._32_1_;
    local_88._8_8_ = CONCAT44(val._4_4_,val.typ_);
    _local_70 = val.val_.floatval_.len_;
    uStack_68 = val.val_._16_8_;
    local_88._16_8_ = val.val_.intval_;
    local_88._0_8_ = &PTR_gen_code_0030e698;
    pCVar8 = (CTcGenTarg *)local_88;
    CTPNConst::gen_code((CTPNConst *)pCVar8,0,0);
    linker_ensure_mod_obj(pCVar8,"Object",6);
  }
  else if (len == 0) {
    pCVar8 = G_cg;
    write_op(G_cg,'\b');
    linker_ensure_mod_obj(pCVar8,"Object",6);
  }
  else {
LAB_001e595d:
    pCVar8 = (CTcGenTarg *)G_prs->global_symtab_;
    mc = (CTcSymMetaclass *)CTcPrsSymtab::find((CTcPrsSymtab *)pCVar8,sym_01,len);
    if (mc == (CTcSymMetaclass *)0x0) {
LAB_001e5abc:
      CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2b18,len & 0xffffffff,
                         sym_01);
      return;
    }
    iVar5 = *(int *)&(mc->super_CTcSymMetaclassBase).super_CTcSymbol.super_CTcSymbolBase.
                     super_CVmHashEntryCS.super_CVmHashEntry.field_0x24;
    if (iVar5 == 9) {
      pCVar10 = (CTcSymMetaclass *)(ulong)(mc->super_CTcSymMetaclassBase).class_obj_;
      linker_ensure_mod_obj(pCVar8,mc);
      iVar5 = -1;
    }
    else {
      if (iVar5 != 2) {
        CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2bca,len & 0xffffffff,
                           sym_01,(ulong)(uint)((int)uVar7 + ((int)pcVar2 - (int)sym_00)),sym_00);
        return;
      }
      if ((mc[1].super_CTcSymMetaclassBase.field_0x58 & 1) != 0) goto LAB_001e5abc;
      pCVar10 = (mc->super_CTcSymMetaclassBase).super_meta_;
      iVar5 = mc[1].super_CTcSymMetaclassBase.meta_idx_;
    }
    local_b9 = local_b9 & 0xfe;
    local_88._8_4_ = TC_CVT_OBJ;
    local_70 = iVar5;
    local_88._0_8_ = &PTR_gen_code_0030e698;
    local_88._16_8_ = pCVar10;
    local_60 = local_b9;
    CTPNConst::gen_code((CTPNConst *)local_88,0,0);
  }
  pCVar8 = G_cg;
  iVar5 = G_cg->sp_depth_;
  uVar1 = iVar5 + 1;
  in_RCX = (size_t)uVar1;
  G_cg->sp_depth_ = uVar1;
  if (pCVar8->max_sp_depth_ <= iVar5) {
    pCVar8->max_sp_depth_ = uVar1;
  }
  lVar12 = lVar12 + ~uVar13;
  uVar11 = uVar11 + 1;
  goto LAB_001e58dc;
}

Assistant:

void CTcGenTarg::multimethod_init_cb(void *ctx0, CTcSymbol *sym)
{
    mminit_ctx *ctx = (mminit_ctx *)ctx0;
    
    /* if this is a function, check to see if it's a multi-method instance */
    if (sym->get_type() == TC_SYM_FUNC)
    {
        CTcSymFunc *fsym = (CTcSymFunc *)sym;

        /* 
         *   multi-method instances have names of the form
         *   "name*type1,type2", so check the name to see if it fits the
         *   pattern 
         */
        const char *p = sym->getstr();
        size_t rem = sym->getlen();
        int is_mm = FALSE;
        for ( ; rem != 0 ; ++p, --rem)
        {
            /* 
             *   if we found a '*', it's a multimethod; otherwise, if it's
             *   anything other than a symbol character, it's not a
             *   multimethod 
             */
            if (*p == '*')
            {
                is_mm = TRUE;
                break;
            }
            else if (!is_sym(*p))
                break;
        }

        /* 
         *   If it's a multi-method symbol, build the initializer.  If it's
         *   the base function for a multi-method, build out the stub
         *   function. 
         */
        if (is_mm)
        {
            int argc;
            
            /* note the function base name - it's the part up to the '*' */
            const char *funcname = sym->getstr();
            size_t funclen = (size_t)(p - funcname);

            /* look up the base function symbol */
            CTcSymFunc *base_sym = (CTcSymFunc *)G_prs->get_global_symtab()
                                   ->find(funcname, funclen);

            /* if it's not defined as a function, ignore it */
            if (base_sym == 0 || base_sym->get_type() != TC_SYM_FUNC)
                return;

            /* 
             *   skip to the end of the string, and remove the '*' from the
             *   length count 
             */
            p += rem;
            --rem;

            /* 
             *   Run through the decorated name and look up each mentioned
             *   class.  We need to push the parameters onto the stack in
             *   reverse order to match the VM calling conventions.  
             */
            for (argc = 0 ; rem != 0 ; ++argc)
            {
                /* remember where the current name starts */
                size_t plen;

                /* skip the terminator for this item */
                --p, --rem;

                /* scan backwards to the previous delimiter */
                for (plen = 0 ; rem != 0 && *(p-1) != ';' ;
                     --p, --rem, ++plen) ;

                /* look up this name */
                if (plen == 0)
                {
                    /* 
                     *   empty name - this slot accepts any type; represent
                     *   this in the run-time formal list with 'nil' 
                     */
                    G_cg->write_op(OPC_PUSHNIL);

                    /* 
                     *   An untyped slot is implicitly an Object slot, so we
                     *   need to make sure that Object can participate in the
                     *   binding property system by ensuring that it has a
                     *   modifier object. 
                     */
                    G_cg->linker_ensure_mod_obj("Object", 6);
                }
                else if (plen == 3 && memcmp(p, "...", 3) == 0)
                {
                    /* 
                     *   varargs indicator - represent this in the list with
                     *   the literal string '...' 
                     */
                    CTcConstVal val;
                    val.set_sstr("...", 3);
                    CTPNConst cval(&val);
                    cval.gen_code(FALSE, FALSE);

                    /* 
                     *   a varargs slot is implicitly an Object slot, so make
                     *   sure Object has a modifier object
                     */
                    G_cg->linker_ensure_mod_obj("Object", 6);
                }
                else
                {
                    /* class name - look it up */
                    CTcSymbol *cl = G_prs->get_global_symtab()->find(p, plen);
                    CTcConstVal val;

                    /* 
                     *   if it's missing, unresolved, or not an object, flag
                     *   an error 
                     */
                    if (cl == 0
                        || (cl->get_type() == TC_SYM_OBJ
                            && ((CTcSymObj *)cl)->is_extern()))
                    {
                        G_tcmain->log_error(
                            0, 0, TC_SEV_ERROR, TCERR_UNDEF_SYM,
                            (int)plen, p);
                        return;
                    }
                    else if (cl->get_type() == TC_SYM_OBJ)
                    {
                        /* get the object information */
                        CTcSymObj *co = (CTcSymObj *)cl;
                        val.set_obj(co->get_obj_id(), co->get_metaclass());
                    }
                    else if (cl->get_type() == TC_SYM_METACLASS)
                    {
                        /* get the metaclass information */
                        CTcSymMetaclass *cm = (CTcSymMetaclass *)cl;
                        val.set_obj(cm->get_class_obj(), TC_META_UNKNOWN);

                        /*
                         *   If this metaclass doesn't have a modifier
                         *   object, create one for it.  This is needed
                         *   because the run-time library's multi-method
                         *   implementation stores the method binding
                         *   information in properties of the parameter
                         *   objects.  Since we're using this metaclass as a
                         *   parameter type, we'll need to write at least one
                         *   property to it.  We can only write properties to
                         *   intrinsic class objects when they're equipped
                         *   with modifier objects.
                         *   
                         *   The presence of a modifier object has no effect
                         *   at all on performance for ordinary method call
                         *   operations on the intrinsic class, and the
                         *   modifier itself is just a bare object, so the
                         *   cost of creating this extra object is trivial.  
                         */
                        G_cg->linker_ensure_mod_obj(cm);
                    }
                    else
                    {
                        /* it's not a valid object type */
                        G_tcmain->log_error(
                            0, 0, TC_SEV_ERROR, TCERR_MMPARAM_NOT_OBJECT,
                            (int)plen, p, (int)funclen, funcname);
                        return;
                    }

                    /* 
                     *   represent the object or class in the parameter list
                     *   with the object reference
                     */
                    CTPNConst cval(&val);
                    cval.gen_code(FALSE, FALSE);
                }

                /* note the value we pushed */
                G_cg->note_push();
            }

            /* build and push the list from the parameters */
            if (argc <= 255)
            {
                G_cg->write_op(OPC_NEW1);
                G_cs->write((char)argc);
            }
            else
            {
                G_cg->write_op(OPC_NEW2);
                G_cs->write2(argc);
            }
            G_cs->write((char)G_cg->get_predef_meta_idx(TCT3_METAID_LIST));
            G_cg->write_op(OPC_GETR0);
            G_cg->note_pop(argc);
            G_cg->note_push();

            /* push the function pointer argument */
            fsym->gen_code(FALSE);

            /* push the base function pointer argument */
            base_sym->gen_code(FALSE);

            /* 
             *   call _multiMethodRegister, if it's available (if it's not,
             *   our caller will flag this as an error, so just skip the code
             *   generation here) 
             */
            if (ctx->mmr != 0)
            {
                G_cg->write_op(OPC_CALL);
                G_cs->write(3);                           /* argument count */
                ctx->mmr->add_abs_fixup(G_cs);    /* function address fixup */
                G_cs->write4(0);                       /* fixup placeholder */
            }

            /* the 3 arguments will be gone on return */
            G_cg->note_pop(3);

            /* count the registration */
            ctx->cnt += 1;
        }
    }
}